

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void ClearShrink<std::vector<bool,std::allocator<bool>>>(vector<bool,_std::allocator<bool>_> *v)

{
  long lVar1;
  vector<bool,_std::allocator<bool>_> *in_RDI;
  long in_FS_OFFSET;
  vector<bool,_std::allocator<bool>_> *this;
  vector<bool,_std::allocator<bool>_> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (vector<bool,_std::allocator<bool>_> *)0x0;
  this = (vector<bool,_std::allocator<bool>_> *)&stack0xffffffffffffffc8;
  std::vector<bool,_std::allocator<bool>_>::vector(this);
  std::vector<bool,_std::allocator<bool>_>::swap(this_00,in_RDI);
  std::vector<bool,_std::allocator<bool>_>::~vector(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void ClearShrink(V& v) noexcept
{
    // There are various ways to clear a vector and release its memory:
    //
    // 1. V{}.swap(v)
    // 2. v = V{}
    // 3. v = {}; v.shrink_to_fit();
    // 4. v.clear(); v.shrink_to_fit();
    //
    // (2) does not appear to release memory in glibc debug mode, even if v.shrink_to_fit()
    // follows. (3) and (4) rely on std::vector::shrink_to_fit, which is only a non-binding
    // request. Therefore, we use method (1).

    V{}.swap(v);
}